

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sid.cc
# Opt level: O1

clock_t __thiscall SID::clock(SID *this)

{
  sampling_method sVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  long lVar4;
  int in_ECX;
  short *in_RDX;
  int iVar5;
  short sVar6;
  cycle_count *in_RSI;
  int in_R8D;
  uint uVar7;
  uint uVar8;
  uint local_40;
  
  sVar1 = this->sampling;
  if (sVar1 == SAMPLE_INTERPOLATE) {
    iVar3 = clock_interpolate(this,in_RSI,in_RDX,in_ECX,in_R8D);
    return CONCAT44(extraout_var_01,iVar3);
  }
  if (sVar1 == SAMPLE_RESAMPLE_INTERPOLATE) {
    iVar3 = clock_resample_interpolate(this,in_RSI,in_RDX,in_ECX,in_R8D);
    return CONCAT44(extraout_var_00,iVar3);
  }
  if (sVar1 != SAMPLE_RESAMPLE_FAST) {
    uVar8 = 0;
    do {
      uVar7 = this->sample_offset + this->cycles_per_sample + 0x8000;
      iVar5 = (int)uVar7 >> 0x10;
      iVar3 = 2;
      uVar2 = local_40;
      if ((iVar5 <= *in_RSI) && (iVar3 = 1, uVar2 = uVar8, (int)uVar8 < in_ECX)) {
        clock(this);
        *in_RSI = *in_RSI - iVar5;
        this->sample_offset = (uVar7 & 0xffff) - 0x8000;
        iVar3 = (this->extfilt).Vo;
        lVar4 = (long)iVar3;
        sVar6 = (short)(uint)((ulong)(lVar4 * 0x2e8ba2e9) >> 0x21) - (short)(iVar3 >> 0x1f);
        if (lVar4 < -0x5800a) {
          sVar6 = -0x8000;
        }
        if (0x57fff < lVar4) {
          sVar6 = 0x7fff;
        }
        in_RDX[(int)(uVar8 * in_R8D)] = sVar6;
        iVar3 = 0;
        uVar8 = uVar8 + 1;
        uVar2 = local_40;
      }
      local_40 = uVar2;
    } while (iVar3 == 0);
    if (iVar3 == 2) {
      clock(this);
      this->sample_offset = this->sample_offset + *in_RSI * -0x10000;
      *in_RSI = 0;
      local_40 = uVar8;
    }
    return (ulong)local_40;
  }
  iVar3 = clock_resample_fast(this,in_RSI,in_RDX,in_ECX,in_R8D);
  return CONCAT44(extraout_var,iVar3);
}

Assistant:

int SID::clock(cycle_count& delta_t, short* buf, int n, int interleave)
{
  switch (sampling) {
  default:
  case SAMPLE_FAST:
    return clock_fast(delta_t, buf, n, interleave);
  case SAMPLE_INTERPOLATE:
    return clock_interpolate(delta_t, buf, n, interleave);
  case SAMPLE_RESAMPLE_INTERPOLATE:
    return clock_resample_interpolate(delta_t, buf, n, interleave);
  case SAMPLE_RESAMPLE_FAST:
    return clock_resample_fast(delta_t, buf, n, interleave);
  }
}